

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid)

{
  REF_INT *pRVar1;
  REF_INT node;
  int node1;
  REF_MPI ref_mpi;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  REF_INT cell;
  REF_CELL ref_cell;
  long lVar8;
  bool bVar9;
  double dVar10;
  REF_DBL min_quality;
  REF_BOOL has_side;
  REF_DBL min_angle;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_DBL min_normdev;
  REF_DBL quality;
  REF_INT max_id;
  REF_DBL normdev;
  REF_INT min_id;
  REF_BOOL geom_node;
  REF_DBL angle;
  REF_DBL dx1 [3];
  REF_INT nodes [27];
  double local_170;
  int local_164;
  ulong local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  int local_124;
  double local_120;
  uint local_118;
  int local_114;
  double local_110;
  double local_108;
  REF_NODE local_100;
  double local_f8;
  REF_GEOM local_f0;
  double local_e8 [4];
  double local_c8 [3];
  int iStack_ac;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  uVar3 = ref_cell_id_range(ref_cell,ref_mpi,(REF_INT *)&local_118,&local_124);
  if (uVar3 == 0) {
    uVar3 = 0;
    if ((int)local_118 <= local_124) {
      do {
        local_160 = (ulong)local_118;
        local_170 = 1.0;
        if (0 < ref_cell->max) {
          iVar6 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar6,local_a8);
            if ((RVar4 == 0) && ((int)local_160 == local_a8[ref_cell->node_per])) {
              uVar3 = ref_node_tri_quality(ref_grid->node,local_a8,&local_130);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x21c,"ref_adapt_tattle_faces",(ulong)uVar3,"qual");
                return uVar3;
              }
              if (local_130 <= local_170) {
                local_170 = local_130;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < ref_cell->max);
        }
        local_130 = local_170;
        uVar3 = ref_mpi_min(ref_mpi,&local_130,&local_170,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x220,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_130,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x221,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
          return uVar3;
        }
        local_138 = 2.0;
        local_158 = 90.0;
        if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) &&
           (ref_cell = ref_grid->cell[3], 0 < ref_cell->max)) {
          cell = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
            if ((RVar4 == 0) && ((int)local_160 == local_a8[ref_cell->node_per])) {
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_120);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x22a,"ref_adapt_tattle_faces",(ulong)uVar3,"norm dev");
                return uVar3;
              }
              if (local_120 <= local_138) {
                local_138 = local_120;
              }
              local_100 = ref_grid->node;
              local_f0 = ref_grid->geom;
              lVar8 = 0;
              do {
                node = local_a8[lVar8];
                uVar3 = ref_geom_is_a(local_f0,node,0,&local_114);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x1eb,"ref_adapt_min_sliver_angle",(ulong)uVar3,"geom node check");
                  goto LAB_001a5268;
                }
                if (local_114 != 0) {
                  lVar7 = 0;
                  if (lVar8 != 2) {
                    lVar7 = lVar8 + 1;
                  }
                  lVar5 = (long)((int)lVar8 + -1);
                  iVar6 = local_a8[lVar7];
                  if (lVar8 == 0) {
                    lVar5 = 2;
                  }
                  node1 = local_a8[lVar5];
                  uVar3 = ref_cell_has_side(ref_grid->cell[0],node,iVar6,&local_164);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,500,"ref_adapt_min_sliver_angle",(ulong)uVar3,"has edge node-node1");
                    goto LAB_001a5268;
                  }
                  if (local_164 != 0) {
                    uVar3 = ref_cell_has_side(ref_grid->cell[0],node,node1,&local_164);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x1f7,"ref_adapt_min_sliver_angle",(ulong)uVar3,"has edge node-node2")
                      ;
                      goto LAB_001a5268;
                    }
                    if (local_164 != 0) {
                      pRVar2 = local_100->real;
                      lVar7 = 0;
                      do {
                        local_c8[lVar7] =
                             pRVar2[(long)iVar6 * 0xf + lVar7] - pRVar2[(long)node * 0xf + lVar7];
                        local_e8[lVar7] =
                             pRVar2[(long)node1 * 0xf + lVar7] - pRVar2[(long)node * 0xf + lVar7];
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != 3);
                      uVar3 = ref_math_normalize(local_c8);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x1ff,"ref_adapt_min_sliver_angle",(ulong)uVar3,"dx1");
                        goto LAB_001a5268;
                      }
                      uVar3 = ref_math_normalize(local_e8);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x200,"ref_adapt_min_sliver_angle",(ulong)uVar3,"dx2");
                        goto LAB_001a5268;
                      }
                      local_108 = local_c8[2] * local_e8[2] +
                                  local_c8[0] * local_e8[0] + local_c8[1] * local_e8[1];
                      local_f8 = local_158;
                      dVar10 = acos(local_108);
                      if ((dVar10 * 180.0) / 3.14159265358979 <= local_f8) {
                        dVar10 = acos(local_108);
                        local_158 = (dVar10 * 180.0) / 3.14159265358979;
                      }
                    }
                  }
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 != 3);
              uVar3 = 0;
LAB_001a5268:
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x22d,"ref_adapt_tattle_faces",(ulong)uVar3,"sliver angle");
                return uVar3;
              }
            }
            cell = cell + 1;
          } while (cell < ref_cell->max);
        }
        local_120 = local_138;
        uVar3 = ref_mpi_min(ref_mpi,&local_120,&local_138,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x231,"ref_adapt_tattle_faces",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_138,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x232,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
          return uVar3;
        }
        local_110 = local_158;
        uVar3 = ref_mpi_min(ref_mpi,&local_110,&local_158,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x234,"ref_adapt_tattle_faces",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_158,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x235,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
          return uVar3;
        }
        local_148 = 1e+200;
        local_150 = -1e+200;
        if (0 < ref_cell->max) {
          iVar6 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar6,local_a8);
            if ((RVar4 == 0) && ((int)local_160 == local_a8[ref_cell->node_per])) {
              lVar8 = 0;
              do {
                bVar9 = lVar8 != 2;
                pRVar1 = local_a8 + lVar8;
                lVar8 = lVar8 + 1;
                lVar7 = 0;
                if (bVar9) {
                  lVar7 = lVar8;
                }
                uVar3 = ref_node_ratio(ref_grid->node,*pRVar1,local_a8[lVar7],&local_140);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x241,"ref_adapt_tattle_faces",(ulong)uVar3,"rat");
                  return uVar3;
                }
                if (local_140 <= local_148) {
                  local_148 = local_140;
                }
                if (local_150 <= local_140) {
                  local_150 = local_140;
                }
              } while (lVar8 != 3);
              if (local_130 <= local_170) {
                local_170 = local_130;
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 < ref_cell->max);
        }
        local_140 = local_148;
        uVar3 = ref_mpi_min(ref_mpi,&local_140,&local_148,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x248,"ref_adapt_tattle_faces",(ulong)uVar3,"mpi min");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_148,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x249,"ref_adapt_tattle_faces",(ulong)uVar3,"min");
          return uVar3;
        }
        local_140 = local_150;
        uVar3 = ref_mpi_max(ref_mpi,&local_140,&local_150,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x24b,"ref_adapt_tattle_faces",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        uVar3 = ref_mpi_bcast(ref_mpi,&local_150,1,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x24c,"ref_adapt_tattle_faces",(ulong)uVar3,"max");
          return uVar3;
        }
        if ((ref_mpi->id == 0) &&
           ((((local_170 < 0.1 || (local_148 < 0.1)) || (4.0 < local_150)) || (local_138 < 0.5)))) {
          printf("face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f topo angle %5.2f\n",
                 local_160);
        }
        local_118 = (int)local_160 + 1;
        uVar3 = 0;
      } while ((int)local_160 < local_124);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x216,
           "ref_adapt_tattle_faces",(ulong)uVar3,"id range");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_DBL angle, min_angle;
  REF_INT edge, n0, n1;
  REF_INT id, min_id, max_id;

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  for (id = min_id; id <= max_id; id++) {
    min_quality = 1.0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      min_quality = MIN(min_quality, quality);
    }
    quality = min_quality;
    RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

    min_normdev = 2.0;
    min_angle = 90.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
        min_normdev = MIN(min_normdev, normdev);
        RSS(ref_adapt_min_sliver_angle(ref_grid, nodes, &min_angle),
            "sliver angle");
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    angle = min_angle;
    RSS(ref_mpi_min(ref_mpi, &angle, &min_angle, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_angle, 1, REF_DBL_TYPE), "min");

    min_ratio = REF_DBL_MAX;
    max_ratio = REF_DBL_MIN;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      for (edge = 0; edge < 3; edge++) {
        n0 = edge;
        n1 = edge + 1;
        if (n1 > 2) n1 -= 3;
        RSS(ref_node_ratio(ref_grid_node(ref_grid), nodes[n0], nodes[n1],
                           &ratio),
            "rat");
        min_ratio = MIN(min_ratio, ratio);
        max_ratio = MAX(max_ratio, ratio);
      }
      min_quality = MIN(min_quality, quality);
    }
    ratio = min_ratio;
    RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
    RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
    ratio = max_ratio;
    RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

    if (ref_mpi_once(ref_mpi)) {
      if (min_quality < 0.1 || min_ratio < 0.1 || max_ratio > 4.0 ||
          min_normdev < 0.5) {
        printf(
            "face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f"
            " topo angle %5.2f\n",
            id, min_quality, min_ratio, max_ratio, min_normdev, angle);
      }
    }
  }

  return REF_SUCCESS;
}